

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

int __thiscall rcg::Interface::close(Interface *this,int __fd)

{
  int iVar1;
  int iVar2;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar2 = (int)&local_28;
  std::mutex::lock(&this->mtx);
  if ((0 < this->n_open) && (iVar1 = this->n_open + -1, this->n_open = iVar1, iVar1 == 0)) {
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->IFClose)(this->ifh);
    this->ifh = (void *)0x0;
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->nodemap).
                super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    System::close((this->parent).super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  iVar2);
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar2;
}

Assistant:

void Interface::close()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      gentl->IFClose(ifh);
      ifh=0;

      nodemap=0;
      cport=0;

      parent->close();
    }
  }
}